

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O3

void testing::internal::Log(LogSeverity severity,string *message,int stack_frames_to_skip)

{
  bool bVar1;
  UnitTest *this;
  int skip_count;
  pointer in_RCX;
  size_type sVar2;
  char *pcVar3;
  string local_38;
  
  bVar1 = LogIsVisible(severity);
  if (bVar1) {
    MutexBase::Lock((MutexBase *)g_log_mutex);
    if (severity == kWarning) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nGMOCK WARNING:",0xf);
    }
    sVar2 = message->_M_string_length;
    if ((sVar2 == 0) || (pcVar3 = (message->_M_dataplus)._M_p, *pcVar3 != '\n')) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      pcVar3 = (message->_M_dataplus)._M_p;
      sVar2 = message->_M_string_length;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar2);
    if (-1 < stack_frames_to_skip) {
      if ((message->_M_string_length != 0) &&
         (in_RCX = (message->_M_dataplus)._M_p, in_RCX[message->_M_string_length - 1] != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      skip_count = (int)in_RCX;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Stack trace:\n",0xd)
      ;
      this = UnitTest::GetInstance();
      GetCurrentOsStackTraceExceptTop_abi_cxx11_
                (&local_38,(internal *)this,(UnitTest *)(ulong)(stack_frames_to_skip + 1),skip_count
                );
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    std::ostream::flush();
    MutexBase::Unlock((MutexBase *)g_log_mutex);
  }
  return;
}

Assistant:

GTEST_API_ void Log(LogSeverity severity, const std::string& message,
                    int stack_frames_to_skip) {
  if (!LogIsVisible(severity))
    return;

  // Ensures that logs from different threads don't interleave.
  MutexLock l(&g_log_mutex);

  // "using ::std::cout;" doesn't work with Symbian's STLport, where cout is a
  // macro.

  if (severity == kWarning) {
    // Prints a GMOCK WARNING marker to make the warnings easily searchable.
    std::cout << "\nGMOCK WARNING:";
  }
  // Pre-pends a new-line to message if it doesn't start with one.
  if (message.empty() || message[0] != '\n') {
    std::cout << "\n";
  }
  std::cout << message;
  if (stack_frames_to_skip >= 0) {
#ifdef NDEBUG
    // In opt mode, we have to be conservative and skip no stack frame.
    const int actual_to_skip = 0;
#else
    // In dbg mode, we can do what the caller tell us to do (plus one
    // for skipping this function's stack frame).
    const int actual_to_skip = stack_frames_to_skip + 1;
#endif  // NDEBUG

    // Appends a new-line to message if it doesn't end with one.
    if (!message.empty() && *message.rbegin() != '\n') {
      std::cout << "\n";
    }
    std::cout << "Stack trace:\n"
         << ::testing::internal::GetCurrentOsStackTraceExceptTop(
             ::testing::UnitTest::GetInstance(), actual_to_skip);
  }
  std::cout << ::std::flush;
}